

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgtool.cpp
# Opt level: O1

int makeemitters(int argc,char **argv)

{
  long lVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  bool bVar12;
  bool bVar13;
  bool bVar14;
  undefined8 uVar15;
  byte bVar16;
  byte bVar17;
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pIVar18;
  bool bVar19;
  int iVar20;
  uint uVar21;
  Allocator alloc;
  float *pfVar22;
  int iVar23;
  float *pfVar24;
  ulong uVar25;
  int iVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  size_t sVar30;
  char *pcVar31;
  long *plVar32;
  long lVar33;
  ushort uVar34;
  undefined1 auVar35 [64];
  undefined1 auVar36 [64];
  undefined1 auVar37 [64];
  undefined1 auVar38 [64];
  undefined1 auVar39 [64];
  undefined1 auVar40 [64];
  undefined1 auVar41 [16];
  undefined4 in_XMM8_Db;
  undefined8 in_XMM8_Qb;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  requestedChannels;
  int downsampleRate;
  ImageChannelValues pSum;
  ImageChannelDesc rgbDesc;
  ImageChannelValues p;
  ImageAndMetadata im;
  int local_384;
  ulong local_380;
  char **local_378;
  float local_370;
  float local_36c;
  float local_368;
  float local_364;
  ulong local_360;
  undefined1 local_358 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_348;
  undefined1 *puStack_338;
  size_t sStack_330;
  undefined1 auStack_328 [16];
  long *aplStack_318 [2];
  long local_308 [2];
  ImageChannelDesc local_2f8;
  ulong local_2c8;
  ulong local_2c0;
  long local_2b8;
  long local_2b0;
  _Any_data local_2a8;
  code *local_298;
  code *local_290;
  undefined1 local_280 [32];
  size_t local_260;
  size_t local_258;
  undefined1 local_250 [16];
  InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_240;
  polymorphic_allocator<unsigned_char> local_198;
  uchar *local_190;
  size_t local_188;
  size_t local_180;
  polymorphic_allocator<pbrt::Half> local_178;
  Half *local_170;
  size_t local_168;
  size_t local_160;
  polymorphic_allocator<float> local_158;
  float *local_150;
  size_t local_148;
  size_t local_140;
  bool local_134;
  bool local_f0;
  bool local_ac;
  bool local_98;
  bool local_8c;
  bool local_84;
  bool local_7c;
  bool local_70;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
  local_68;
  ColorEncodingHandle local_38;
  
  local_384 = 1;
  local_378 = argv;
  if (*argv == (char *)0x0) {
    pcVar31 = (char *)0x0;
  }
  else {
    pcVar31 = (char *)0x0;
    do {
      local_250._0_8_ = &local_240;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_250,"downsample","");
      local_2a8._M_unused._M_object = (void *)0x0;
      local_2a8._8_8_ = 0;
      local_290 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1703:20)>
                  ::_M_invoke;
      local_298 = std::
                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/imgtool.cpp:1703:20)>
                  ::_M_manager;
      bVar19 = pbrt::ParseArg<int*>
                         (&local_378,(string *)local_250,&local_384,
                          (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                           *)&local_2a8);
      if (local_298 != (code *)0x0) {
        (*local_298)(&local_2a8,&local_2a8,__destroy_functor);
      }
      if ((InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)local_250._0_8_ != &local_240) {
        operator_delete((void *)local_250._0_8_,(ulong)((long)local_240.alloc.memoryResource + 1));
      }
      if (!bVar19) {
        pcVar2 = *local_378;
        if (*pcVar2 == '-') {
          usage("makeemitters","%s: unknown command flag",pcVar2);
        }
        if (pcVar31 != (char *)0x0) {
          pcVar31 = "multiple input filenames provided.";
          goto LAB_001fc857;
        }
        local_378 = local_378 + 1;
        pcVar31 = pcVar2;
      }
    } while (*local_378 != (char *)0x0);
  }
  if (pcVar31 != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_358,pcVar31,(allocator<char> *)&local_2f8);
    alloc.memoryResource = pstd::pmr::new_delete_resource();
    local_38.
    super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
    .bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
             )0;
    pbrt::Image::Read((ImageAndMetadata *)local_250,(string *)local_358,alloc,&local_38);
    if ((undefined1 *)local_358._0_8_ != local_358 + 0x10) {
      operator_delete((void *)local_358._0_8_,local_348._M_allocated_capacity + 1);
    }
    local_358._0_8_ = local_358 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_358,"R","");
    puStack_338 = auStack_328;
    std::__cxx11::string::_M_construct<char_const*>((string *)&puStack_338,"G","");
    plVar32 = local_308;
    aplStack_318[0] = plVar32;
    std::__cxx11::string::_M_construct<char_const*>((string *)aplStack_318,"B","");
    requestedChannels.n = 3;
    requestedChannels.ptr =
         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_358;
    pbrt::Image::GetChannelDesc(&local_2f8,(Image *)local_250,requestedChannels);
    lVar33 = -0x60;
    pIVar18 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_250._0_8_;
    do {
      if (plVar32 != (long *)plVar32[-2]) {
        local_250._0_8_ = pIVar18;
        operator_delete((long *)plVar32[-2],*plVar32 + 1);
        pIVar18 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_250._0_8_;
      }
      local_250._4_4_ = (undefined4)((ulong)pIVar18 >> 0x20);
      plVar32 = plVar32 + -4;
      lVar33 = lVar33 + 0x20;
    } while (lVar33 != 0);
    local_250._0_8_ = pIVar18;
    if (local_2f8.offset.nStored == 0) {
      fprintf(_stderr,"%s: didn\'t find R, G, and B channels",pcVar31);
      iVar20 = 1;
    }
    else {
      local_360 = CONCAT44(local_250._8_4_,local_250._4_4_);
      puts("AttributeBegin");
      puts("Material \"matte\" \"rgb Kd\" [0 0 0]");
      if (0 < (int)local_250._8_4_) {
        local_2c8 = local_360 >> 0x20;
        iVar20 = (int)local_360;
        local_36c = (float)iVar20 / (float)(int)(local_360 >> 0x20);
        local_370 = local_36c * -0.5;
        local_2b0 = (long)local_360 >> 0x20;
        local_380 = 0;
        pIVar18 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)local_250._0_8_;
        do {
          local_250._4_4_ = (undefined4)((ulong)pIVar18 >> 0x20);
          bVar19 = 0 < (int)local_250._4_4_;
          local_250._0_8_ = pIVar18;
          if (bVar19) {
            local_368 = (float)(int)local_380;
            local_2b8 = (long)(int)local_380;
            uVar27 = 0;
            do {
              sVar30 = local_2f8.offset.nStored;
              local_364 = 0.0;
              local_280._0_8_ = pstd::pmr::new_delete_resource();
              pbrt::InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_>::InlinedVector
                        ((InlinedVector<float,_4,_pstd::pmr::polymorphic_allocator<float>_> *)
                         local_358,sVar30,&local_364,(polymorphic_allocator<float> *)local_280);
              auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
              auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
              uVar29 = uVar27;
              if (0 < local_384) {
                local_2c0 = uVar27;
                lVar33 = 0;
                do {
                  if (0 < local_384) {
                    lVar1 = lVar33 + local_2b8;
                    lVar28 = 0;
                    do {
                      uVar29 = lVar28 + (int)uVar27;
                      if (((long)uVar29 < (long)iVar20) || (lVar1 < local_2b0)) {
                        pbrt::Image::GetChannels
                                  ((ImageChannelValues *)local_280,(Image *)local_250,
                                   (Point2i)(uVar29 & 0xffffffff | lVar1 << 0x20),&local_2f8,
                                   (WrapMode2D)0x200000002);
                        if (local_258 != 0) {
                          pfVar22 = (float *)local_280._8_8_;
                          if ((float *)local_280._8_8_ == (float *)0x0) {
                            pfVar22 = (float *)(local_280 + 0x10);
                          }
                          pfVar24 = (float *)local_358._8_8_;
                          if ((float *)local_358._8_8_ == (float *)0x0) {
                            pfVar24 = (float *)(local_358 + 0x10);
                          }
                          sVar30 = 0;
                          do {
                            pfVar24[sVar30] = pfVar22[sVar30] + pfVar24[sVar30];
                            sVar30 = sVar30 + 1;
                          } while (local_258 != sVar30);
                        }
                        local_258 = 0;
                        (*(*(_func_int ***)local_280._0_8_)[3])
                                  (local_280._0_8_,local_280._8_8_,local_260 << 2,4);
                        auVar35 = vpmovsxbq_avx512f(ZEXT816(0xf0e0d0c0b0a0908));
                        auVar36 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
                      }
                      lVar28 = lVar28 + 1;
                    } while (lVar28 < local_384);
                  }
                  lVar33 = lVar33 + 1;
                  uVar29 = local_2c0;
                } while (lVar33 < local_384);
              }
              if (sStack_330 != 0) {
                pfVar22 = (float *)local_358._8_8_;
                if ((float *)local_358._8_8_ == (float *)0x0) {
                  pfVar22 = (float *)(local_358 + 0x10);
                }
                auVar41._0_4_ = (float)(local_384 * local_384);
                auVar41._8_8_ = in_XMM8_Qb;
                auVar41._4_4_ = in_XMM8_Db;
                uVar27 = sStack_330 + 0xf;
                auVar37 = vpbroadcastq_avx512f();
                auVar38 = vbroadcastss_avx512f(auVar41);
                uVar25 = 0;
                do {
                  auVar39 = vpbroadcastq_avx512f();
                  auVar40 = vporq_avx512f(auVar39,auVar35);
                  auVar39 = vporq_avx512f(auVar39,auVar36);
                  uVar15 = vpcmpuq_avx512f(auVar39,auVar37,2);
                  bVar16 = (byte)uVar15;
                  uVar15 = vpcmpuq_avx512f(auVar40,auVar37,2);
                  bVar17 = (byte)uVar15;
                  uVar34 = CONCAT11(bVar17,bVar16);
                  pfVar24 = pfVar22 + uVar25;
                  auVar39._4_4_ = (uint)((byte)(uVar34 >> 1) & 1) * (int)pfVar24[1];
                  auVar39._0_4_ = (uint)(bVar16 & 1) * (int)*pfVar24;
                  auVar39._8_4_ = (uint)((byte)(uVar34 >> 2) & 1) * (int)pfVar24[2];
                  auVar39._12_4_ = (uint)((byte)(uVar34 >> 3) & 1) * (int)pfVar24[3];
                  auVar39._16_4_ = (uint)((byte)(uVar34 >> 4) & 1) * (int)pfVar24[4];
                  auVar39._20_4_ = (uint)((byte)(uVar34 >> 5) & 1) * (int)pfVar24[5];
                  auVar39._24_4_ = (uint)((byte)(uVar34 >> 6) & 1) * (int)pfVar24[6];
                  auVar39._28_4_ = (uint)((byte)(uVar34 >> 7) & 1) * (int)pfVar24[7];
                  auVar39._32_4_ = (uint)(bVar17 & 1) * (int)pfVar24[8];
                  auVar39._36_4_ = (uint)(bVar17 >> 1 & 1) * (int)pfVar24[9];
                  auVar39._40_4_ = (uint)(bVar17 >> 2 & 1) * (int)pfVar24[10];
                  auVar39._44_4_ = (uint)(bVar17 >> 3 & 1) * (int)pfVar24[0xb];
                  auVar39._48_4_ = (uint)(bVar17 >> 4 & 1) * (int)pfVar24[0xc];
                  auVar39._52_4_ = (uint)(bVar17 >> 5 & 1) * (int)pfVar24[0xd];
                  auVar39._56_4_ = (uint)(bVar17 >> 6 & 1) * (int)pfVar24[0xe];
                  auVar39._60_4_ = (uint)(bVar17 >> 7) * (int)pfVar24[0xf];
                  auVar39 = vdivps_avx512f(auVar39,auVar38);
                  pfVar24 = pfVar22 + uVar25;
                  bVar19 = (bool)((byte)(uVar34 >> 1) & 1);
                  bVar3 = (bool)((byte)(uVar34 >> 2) & 1);
                  bVar4 = (bool)((byte)(uVar34 >> 3) & 1);
                  bVar5 = (bool)((byte)(uVar34 >> 4) & 1);
                  bVar6 = (bool)((byte)(uVar34 >> 5) & 1);
                  bVar7 = (bool)((byte)(uVar34 >> 6) & 1);
                  bVar8 = (bool)((byte)(uVar34 >> 7) & 1);
                  bVar9 = (bool)(bVar17 >> 1 & 1);
                  bVar10 = (bool)(bVar17 >> 2 & 1);
                  bVar11 = (bool)(bVar17 >> 3 & 1);
                  bVar12 = (bool)(bVar17 >> 4 & 1);
                  bVar13 = (bool)(bVar17 >> 5 & 1);
                  bVar14 = (bool)(bVar17 >> 6 & 1);
                  *pfVar24 = (float)((uint)(bVar16 & 1) * auVar39._0_4_ |
                                    (uint)!(bool)(bVar16 & 1) * (int)*pfVar24);
                  pfVar24[1] = (float)((uint)bVar19 * auVar39._4_4_ |
                                      (uint)!bVar19 * (int)pfVar24[1]);
                  pfVar24[2] = (float)((uint)bVar3 * auVar39._8_4_ | (uint)!bVar3 * (int)pfVar24[2])
                  ;
                  pfVar24[3] = (float)((uint)bVar4 * auVar39._12_4_ | (uint)!bVar4 * (int)pfVar24[3]
                                      );
                  pfVar24[4] = (float)((uint)bVar5 * auVar39._16_4_ | (uint)!bVar5 * (int)pfVar24[4]
                                      );
                  pfVar24[5] = (float)((uint)bVar6 * auVar39._20_4_ | (uint)!bVar6 * (int)pfVar24[5]
                                      );
                  pfVar24[6] = (float)((uint)bVar7 * auVar39._24_4_ | (uint)!bVar7 * (int)pfVar24[6]
                                      );
                  pfVar24[7] = (float)((uint)bVar8 * auVar39._28_4_ | (uint)!bVar8 * (int)pfVar24[7]
                                      );
                  pfVar24[8] = (float)((uint)(bVar17 & 1) * auVar39._32_4_ |
                                      (uint)!(bool)(bVar17 & 1) * (int)pfVar24[8]);
                  pfVar24[9] = (float)((uint)bVar9 * auVar39._36_4_ | (uint)!bVar9 * (int)pfVar24[9]
                                      );
                  pfVar24[10] = (float)((uint)bVar10 * auVar39._40_4_ |
                                       (uint)!bVar10 * (int)pfVar24[10]);
                  pfVar24[0xb] = (float)((uint)bVar11 * auVar39._44_4_ |
                                        (uint)!bVar11 * (int)pfVar24[0xb]);
                  pfVar24[0xc] = (float)((uint)bVar12 * auVar39._48_4_ |
                                        (uint)!bVar12 * (int)pfVar24[0xc]);
                  pfVar24[0xd] = (float)((uint)bVar13 * auVar39._52_4_ |
                                        (uint)!bVar13 * (int)pfVar24[0xd]);
                  pfVar24[0xe] = (float)((uint)bVar14 * auVar39._56_4_ |
                                        (uint)!bVar14 * (int)pfVar24[0xe]);
                  pfVar24[0xf] = (float)((uint)(bVar17 >> 7) * auVar39._60_4_ |
                                        (uint)!(bool)(bVar17 >> 7) * (int)pfVar24[0xf]);
                  uVar25 = uVar25 + 0x10;
                } while ((uVar27 & 0xfffffffffffffff0) != uVar25);
              }
              printf("AreaLightSource \"diffuse\" \"rgb L\" [ %f %f %f ]\n");
              iVar26 = (int)uVar29;
              vfmadd213ss_fma(ZEXT416((uint)(1.0 - (float)iVar26 / (float)(int)local_250._4_4_)),
                              ZEXT416((uint)local_36c),ZEXT416((uint)local_370));
              iVar23 = local_384 + iVar26;
              if ((int)local_360 <= local_384 + iVar26) {
                iVar23 = (int)local_360;
              }
              vfmadd213ss_fma(ZEXT416((uint)(1.0 - (float)iVar23 / (float)(int)local_250._4_4_)),
                              ZEXT416((uint)local_36c),ZEXT416((uint)local_370));
              printf("Shape \"bilinear\" \"point3 P\" [ %f %f 0 %f %f 0 %f %f 0 %f %f 0 ]\n");
              sStack_330 = 0;
              (**(code **)(*(long *)local_358._0_8_ + 0x18))
                        (local_358._0_8_,local_358._8_8_,(long)puStack_338 << 2,4);
              uVar27 = (ulong)(uint)(iVar26 + local_384);
            } while (iVar26 + local_384 < (int)local_250._4_4_);
          }
          uVar21 = (int)local_380 + local_384;
          local_380 = (ulong)uVar21;
          pIVar18 = (InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_250._0_8_;
        } while ((int)uVar21 < (int)local_250._8_4_);
      }
      puts("AttributeEnd");
      iVar20 = 0;
    }
    local_2f8.offset.nStored = 0;
    (*(local_2f8.offset.alloc.memoryResource)->_vptr_memory_resource[3])
              (local_2f8.offset.alloc.memoryResource,local_2f8.offset.ptr,
               local_2f8.offset.nAlloc << 2,4);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
    ::~_Rb_tree(&local_68);
    if (local_70 == true) {
      local_70 = false;
    }
    if (local_7c == true) {
      local_7c = false;
    }
    if (local_84 == true) {
      local_84 = false;
    }
    if (local_8c == true) {
      local_8c = false;
    }
    if (local_98 == true) {
      local_98 = false;
    }
    if (local_ac == true) {
      local_ac = false;
    }
    if (local_f0 == true) {
      local_f0 = false;
    }
    if (local_134 == true) {
      local_134 = false;
    }
    local_140 = 0;
    (*(local_158.memoryResource)->_vptr_memory_resource[3])
              (local_158.memoryResource,local_150,local_148 << 2,4);
    local_160 = 0;
    (*(local_178.memoryResource)->_vptr_memory_resource[3])
              (local_178.memoryResource,local_170,local_168 * 2,2);
    local_180 = 0;
    (*(local_198.memoryResource)->_vptr_memory_resource[3])
              (local_198.memoryResource,local_190,local_188,1);
    pbrt::
    InlinedVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_4,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~InlinedVector(&local_240);
    return iVar20;
  }
  pcVar31 = "missing image filename";
LAB_001fc857:
  usage("makeemitters",pcVar31);
}

Assistant:

int makeemitters(int argc, char *argv[]) {
    const char *filename = nullptr;
    int downsampleRate = 1;

    auto onError = [](const std::string &err) {
        usage("makeemitters", "%s", err.c_str());
        exit(1);
    };
    while (*argv != nullptr) {
        if (ParseArg(&argv, "downsample", &downsampleRate, onError)) {
            // success
        } else if (argv[0][0] == '-')
            usage("makeemitters", "%s: unknown command flag", *argv);
        else if (!filename) {
            filename = *argv;
            ++argv;
        } else
            usage("makeemitters", "multiple input filenames provided.");
    }

    if (filename == nullptr)
        usage("makeemitters", "missing image filename");

    ImageAndMetadata im = Image::Read(filename);
    const Image &image = im.image;

    ImageChannelDesc rgbDesc = image.GetChannelDesc({"R", "G", "B"});
    if (!rgbDesc) {
        fprintf(stderr, "%s: didn't find R, G, and B channels", filename);
        return 1;
    }

    Point2i res = image.Resolution();
    float aspect = float(res.x) / float(res.y);
    printf("AttributeBegin\n");
    printf("Material \"matte\" \"rgb Kd\" [0 0 0]\n");
    for (int y = 0; y < image.Resolution().y; y += downsampleRate)
        for (int x = 0; x < image.Resolution().x; x += downsampleRate) {
            ImageChannelValues pSum(rgbDesc.size());
            for (int dy = 0; dy < downsampleRate; ++dy)
                for (int dx = 0; dx < downsampleRate; ++dx) {
                    Point2i pp(x + dx, y + dy);
                    if (pp.x >= res.x && pp.y >= res.y)
                        continue;

                    ImageChannelValues p = image.GetChannels(pp, rgbDesc);
                    for (int c = 0; c < p.size(); ++c)
                        pSum[c] += p[c];
                }
            for (int c = 0; c < pSum.size(); ++c)
                pSum[c] /= downsampleRate * downsampleRate;

            printf("AreaLightSource \"diffuse\" \"rgb L\" [ %f %f %f ]\n", pSum[0],
                   pSum[1], pSum[2]);

            float x0 = aspect * (1 - float(x) / image.Resolution().x) - aspect / 2;
            float x1 = aspect * (1 - float(std::min(x + downsampleRate, res.x)) /
                                         image.Resolution().x) -
                       aspect / 2;
            float y0 = 1 - float(y) / image.Resolution().y;
            float y1 =
                1 - float(std::min(y + downsampleRate, res.y)) / image.Resolution().y;
            printf("Shape \"bilinear\" \"point3 P\" [ %f %f 0 %f %f 0 %f %f 0 "
                   "%f %f 0 ]\n",
                   x0, y0, x1, y0, x0, y1, x1, y1);
        }
    printf("AttributeEnd\n");

    return 0;
}